

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zeDeviceGetSubDevices
          (ze_device_handle_t hDevice,uint32_t *pCount,ze_device_handle_t *phSubdevices)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zeDeviceGetSubDevices(hDevice, pCount, phSubdevices)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0xf0);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar5 = lVar2 - lVar6 >> 3;
    if (lVar2 != lVar6) {
      lVar8 = 0;
      do {
        plVar3 = (long *)**(undefined8 **)(*(long *)(context + 0xd30) + lVar8 * 8);
        result = (**(code **)(*plVar3 + 0xb0))(plVar3,hDevice,pCount,phSubdevices);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0014b1c3;
        lVar8 = lVar8 + 1;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar8);
    }
    lVar8 = context;
    if ((*(char *)(context + 4) != '\x01') ||
       (result = ZEHandleLifetimeValidation::zeDeviceGetSubDevicesPrologue
                           (*(ZEHandleLifetimeValidation **)(context + 0xd48),hDevice,pCount,
                            phSubdevices), result == ZE_RESULT_SUCCESS)) {
      zVar4 = (*pcVar1)(hDevice,pCount,phSubdevices);
      if (lVar2 != lVar6) {
        lVar6 = 0;
        do {
          plVar3 = (long *)**(undefined8 **)(*(long *)(lVar8 + 0xd30) + lVar6 * 8);
          result = (**(code **)(*plVar3 + 0xb8))(plVar3,hDevice,pCount,phSubdevices,zVar4);
          if (result != ZE_RESULT_SUCCESS) goto LAB_0014b1c3;
          lVar6 = lVar6 + 1;
        } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
      }
      result = zVar4;
      if ((((zVar4 == ZE_RESULT_SUCCESS) && (phSubdevices != (ze_device_handle_t *)0x0)) &&
          (*(char *)(lVar8 + 4) != '\0')) && (*pCount != 0)) {
        uVar7 = 0;
        do {
          if (phSubdevices[uVar7] != (ze_device_handle_t)0x0) {
            HandleLifetimeValidation::addHandle
                      (*(HandleLifetimeValidation **)(lVar8 + 0xd48),phSubdevices[uVar7]);
            HandleLifetimeValidation::addDependent
                      (*(HandleLifetimeValidation **)(lVar8 + 0xd48),hDevice,phSubdevices[uVar7]);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < *pCount);
      }
    }
  }
LAB_0014b1c3:
  logAndPropagateResult("zeDeviceGetSubDevices",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetSubDevices(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub-devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub-devices available.
                                                        ///< if count is greater than the number of sub-devices available, then the
                                                        ///< driver shall update the value with the correct number of sub-devices available.
        ze_device_handle_t* phSubdevices                ///< [in,out][optional][range(0, *pCount)] array of handle of sub-devices.
                                                        ///< if count is less than the number of sub-devices available, then driver
                                                        ///< shall only retrieve that number of sub-devices.
        )
    {
        context.logger->log_trace("zeDeviceGetSubDevices(hDevice, pCount, phSubdevices)");

        auto pfnGetSubDevices = context.zeDdiTable.Device.pfnGetSubDevices;

        if( nullptr == pfnGetSubDevices )
            return logAndPropagateResult("zeDeviceGetSubDevices", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetSubDevicesPrologue( hDevice, pCount, phSubdevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetSubDevices", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeDeviceGetSubDevicesPrologue( hDevice, pCount, phSubdevices );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetSubDevices", result);
        }

        auto driver_result = pfnGetSubDevices( hDevice, pCount, phSubdevices );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeDeviceGetSubDevicesEpilogue( hDevice, pCount, phSubdevices ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeDeviceGetSubDevices", result);
        }


        if( driver_result == ZE_RESULT_SUCCESS && context.enableHandleLifetime ){
            
            for (size_t i = 0; ( nullptr != phSubdevices) && (i < *pCount); ++i){
                if (phSubdevices[i]){
                    context.handleLifetime->addHandle( phSubdevices[i] );
                    context.handleLifetime->addDependent( hDevice, phSubdevices[i] );
                }
            }
        }
        return logAndPropagateResult("zeDeviceGetSubDevices", driver_result);
    }